

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng::encode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *in,uint w,uint h,
                    State *state)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uchar *in_00;
  
  uVar4 = (state->super_LodePNGState).info_raw.bitdepth;
  uVar3 = getNumColorChannels((state->super_LodePNGState).info_raw.colortype);
  uVar5 = (ulong)(uVar3 * uVar4);
  puVar1 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ulong)((long)puVar2 - (long)puVar1) <
      (((uint)((ulong)h * (ulong)w) & 7) * uVar5 + 7 >> 3) + ((ulong)h * (ulong)w >> 3) * uVar5) {
    return 0x54;
  }
  in_00 = (uchar *)0x0;
  if (puVar1 != puVar2) {
    in_00 = puVar1;
  }
  uVar4 = encode(out,in_00,w,h,state);
  return uVar4;
}

Assistant:

unsigned encode(std::vector<unsigned char>& out,
                const std::vector<unsigned char>& in, unsigned w, unsigned h,
                State& state) {
  if(lodepng_get_raw_size(w, h, &state.info_raw) > in.size()) return 84;
  return encode(out, in.empty() ? 0 : &in[0], w, h, state);
}